

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O3

void duckdb::TimeBucketOriginFunction<duckdb::date_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  bool bVar2;
  reference a;
  reference b;
  reference c;
  int64_t iVar3;
  ulong uVar4;
  int iVar5;
  idx_t count;
  code *fun;
  interval_t local_38;
  
  a = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  b = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  c = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  if ((a->vector_type != CONSTANT_VECTOR) || (c->vector_type != CONSTANT_VECTOR)) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,args->count,
               TimeBucket::OriginTernaryOperator::
               Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>);
    return;
  }
  puVar1 = (a->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((((puVar1 != (unsigned_long *)0x0) && ((*puVar1 & 1) == 0)) ||
      ((puVar1 = (c->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
       puVar1 != (unsigned_long *)0x0 && ((*puVar1 & 1) == 0)))) ||
     (bVar2 = Value::IsFinite<duckdb::date_t>((date_t)*(int32_t *)c->data), !bVar2)) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  uVar4 = *(ulong *)a->data;
  local_38.micros = *(ulong *)((long)a->data + 8);
  local_38._0_8_ = uVar4;
  if ((int)uVar4 == 0) {
    iVar3 = Interval::GetMicro(&local_38);
    if (0 < iVar3) {
      count = args->count;
      fun = TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::
            Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>;
      goto LAB_01ac5b9b;
    }
    uVar4 = local_38._0_8_ & 0xffffffff;
    iVar5 = local_38.days;
  }
  else {
    iVar5 = (int)(uVar4 >> 0x20);
  }
  count = args->count;
  if ((((int)uVar4 < 1) || (iVar5 != 0)) || (local_38.micros != 0)) {
    TernaryExecutor::
    ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapperWithNulls,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::ValidityMask&,unsigned_long)>
              (a,b,c,result,count,
               TimeBucket::OriginTernaryOperator::
               Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>);
    return;
  }
  fun = TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::
        Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t>;
LAB_01ac5b9b:
  TernaryExecutor::
  ExecuteGeneric<duckdb::interval_t,duckdb::date_t,duckdb::date_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::date_t)>
            (a,b,c,result,count,fun);
  return;
}

Assistant:

static void TimeBucketOriginFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3);

	auto &bucket_width_arg = args.data[0];
	auto &ts_arg = args.data[1];
	auto &origin_arg = args.data[2];

	if (bucket_width_arg.GetVectorType() == VectorType::CONSTANT_VECTOR &&
	    origin_arg.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		if (ConstantVector::IsNull(bucket_width_arg) || ConstantVector::IsNull(origin_arg) ||
		    !Value::IsFinite(*ConstantVector::GetData<T>(origin_arg))) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
		} else {
			interval_t bucket_width = *ConstantVector::GetData<interval_t>(bucket_width_arg);
			TimeBucket::BucketWidthType bucket_width_type = TimeBucket::ClassifyBucketWidth(bucket_width);
			switch (bucket_width_type) {
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MICROS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMicrosTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::CONVERTIBLE_TO_MONTHS:
				TernaryExecutor::Execute<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginWidthConvertibleToMonthsTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			case TimeBucket::BucketWidthType::UNCLASSIFIED:
				TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
				    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
				    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
				break;
			default:
				throw NotImplementedException("Bucket type not implemented for TIME_BUCKET");
			}
		}
	} else {
		TernaryExecutor::ExecuteWithNulls<interval_t, T, T, T>(
		    bucket_width_arg, ts_arg, origin_arg, result, args.size(),
		    TimeBucket::OriginTernaryOperator::Operation<interval_t, T, T, T>);
	}
}